

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O1

void __thiscall YAML::detail::node::node(node *this)

{
  _Rb_tree_header *p_Var1;
  node_ref *this_00;
  
  this_00 = (node_ref *)operator_new(0x10);
  node_ref::node_ref(this_00);
  (this->m_pRef).super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<YAML::detail::node_ref*>
            (&(this->m_pRef).super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,this_00);
  p_Var1 = &(this->m_dependencies)._M_t._M_impl.super__Rb_tree_header;
  (this->m_dependencies)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_dependencies)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (this->m_dependencies)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this->m_dependencies)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->m_dependencies)._M_t._M_impl = 0;
  *(undefined8 *)&(this->m_dependencies)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->m_dependencies)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_dependencies)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_dependencies)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_index = 0;
  return;
}

Assistant:

node() : m_pRef(new node_ref), m_dependencies{}, m_index{} {}